

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_Digests(archive_read *a,_7z_digests *d,size_t num)

{
  int iVar1;
  uchar *p;
  uchar *puVar2;
  uint32_t *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = -1;
  if (num != 0) {
    d->digests = (uint32_t *)0x0;
    puVar2 = (uchar *)malloc(num);
    d->defineds = puVar2;
    if ((puVar2 != (uchar *)0x0) && (puVar2 = header_bytes(a,1), puVar2 != (uchar *)0x0)) {
      if (*puVar2 == '\0') {
        iVar1 = read_Bools(a,d->defineds,num);
        if (iVar1 < 0) {
          return -1;
        }
      }
      else {
        memset(d->defineds,1,num);
      }
      puVar3 = (uint32_t *)calloc(num,4);
      d->digests = puVar3;
      if (puVar3 != (uint32_t *)0x0) {
        for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < num; uVar5 = uVar5 + 1) {
          if (d->defineds[uVar6] != '\0') {
            puVar3 = (uint32_t *)header_bytes(a,4);
            if (puVar3 == (uint32_t *)0x0) {
              return -1;
            }
            d->digests[uVar6] = *puVar3;
          }
        }
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
read_Digests(struct archive_read *a, struct _7z_digests *d, size_t num)
{
	const unsigned char *p;
	unsigned i;

	if (num == 0)
		return (-1);
	memset(d, 0, sizeof(*d));

	d->defineds = malloc(num);
	if (d->defineds == NULL)
		return (-1);
	/*
	 * Read Bools.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == 0) {
		if (read_Bools(a, d->defineds, num) < 0)
			return (-1);
	} else
		/* All are defined */
		memset(d->defineds, 1, num);

	d->digests = calloc(num, sizeof(*d->digests));
	if (d->digests == NULL)
		return (-1);
	for (i = 0; i < num; i++) {
		if (d->defineds[i]) {
			if ((p = header_bytes(a, 4)) == NULL)
				return (-1);
			d->digests[i] = archive_le32dec(p);
		}
	}

	return (0);
}